

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O3

_Bool container_iterator_prev
                (container_t *c,uint8_t typecode,roaring_container_iterator_t *it,uint16_t *value)

{
  long lVar1;
  uint uVar2;
  ulong uVar3;
  ushort uVar4;
  int iVar5;
  undefined7 in_register_00000031;
  ulong uVar6;
  uint uVar7;
  
  iVar5 = (int)CONCAT71(in_register_00000031,typecode);
  if (iVar5 == 3) {
    if (*value == 0) {
      return false;
    }
    uVar4 = *value - 1;
    *value = uVar4;
    lVar1 = *(long *)((long)c + 8);
    iVar5 = it->index;
    if (*(ushort *)(lVar1 + (long)iVar5 * 4) <= uVar4) {
      return true;
    }
    uVar2 = iVar5 - 1;
    it->index = uVar2;
    if (iVar5 < 1) {
      return false;
    }
    uVar2 = (uint)(ushort)(*(short *)(lVar1 + 2 + (ulong)uVar2 * 4) +
                          *(short *)(lVar1 + (ulong)uVar2 * 4));
  }
  else if (iVar5 == 2) {
    iVar5 = it->index;
    uVar2 = iVar5 - 1;
    it->index = uVar2;
    if (iVar5 < 1) {
      return false;
    }
    uVar2 = (uint)*(ushort *)(*(long *)((long)c + 8) + (ulong)uVar2 * 2);
  }
  else {
    iVar5 = it->index;
    uVar2 = iVar5 - 1;
    it->index = uVar2;
    if (iVar5 < 1) {
      return false;
    }
    uVar7 = uVar2 >> 6;
    uVar6 = (ulong)(*(long *)(*(long *)((long)c + 8) + (ulong)uVar7 * 8) << (~(byte)uVar2 & 0x3f))
            >> (~(byte)uVar2 & 0x3f);
    if (uVar6 == 0) {
      uVar3 = (ulong)(uVar2 >> 6);
      do {
        if ((long)uVar3 < 1) {
          return false;
        }
        uVar6 = *(ulong *)(*(long *)((long)c + 8) + -8 + uVar3 * 8);
        uVar3 = uVar3 - 1;
      } while (uVar6 == 0);
      uVar7 = (uint)uVar3;
    }
    lVar1 = 0x3f;
    if (uVar6 != 0) {
      for (; uVar6 >> lVar1 == 0; lVar1 = lVar1 + -1) {
      }
    }
    uVar2 = ((uint)lVar1 ^ 0x3f | uVar7 << 6) ^ 0x3f;
    it->index = uVar2;
  }
  *value = (uint16_t)uVar2;
  return true;
}

Assistant:

bool container_iterator_prev(const container_t *c, uint8_t typecode,
                             roaring_container_iterator_t *it,
                             uint16_t *value) {
    switch (typecode) {
        case BITSET_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }

            const bitset_container_t *bc = const_CAST_bitset(c);
            int32_t wordindex = it->index / 64;
            uint64_t word =
                bc->words[wordindex] & (UINT64_MAX >> (63 - (it->index % 64)));

            while (word == 0 && --wordindex >= 0) {
                word = bc->words[wordindex];
            }
            if (word == 0) {
                return false;
            }

            it->index = (wordindex * 64) + (63 - roaring_leading_zeroes(word));
            *value = it->index;
            return true;
        }
        case ARRAY_CONTAINER_TYPE: {
            if (--it->index < 0) {
                return false;
            }
            const array_container_t *ac = const_CAST_array(c);
            *value = ac->array[it->index];
            return true;
        }
        case RUN_CONTAINER_TYPE: {
            if (*value == 0) {
                return false;
            }

            const run_container_t *rc = const_CAST_run(c);
            (*value)--;
            if (*value >= rc->runs[it->index].value) {
                return true;
            }

            if (--it->index < 0) {
                return false;
            }

            *value = rc->runs[it->index].value + rc->runs[it->index].length;
            return true;
        }
        default:
            assert(false);
            roaring_unreachable;
            return false;
    }
}